

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

void Q_SetLen(QMatrix *Q,size_t RoC,size_t Len)

{
  LASErrIdType LVar1;
  ElType *pEVar2;
  char *Object1Name;
  
  LVar1 = LASResult();
  if (LVar1 != LASOK) {
    return;
  }
  if (RoC == 0 || Q->Instance != Normal) {
    if (Q->Instance != Normal) {
      Object1Name = Q->Name;
      LVar1 = LASLValErr;
      goto LAB_0010e694;
    }
  }
  else if (RoC <= Q->Dim) {
    Q->Len[RoC] = Len;
    if (Q->El[RoC] != (ElType *)0x0) {
      free(Q->El[RoC]);
    }
    if (Len == 0) {
      Q->El[RoC] = (ElType *)0x0;
      return;
    }
    pEVar2 = (ElType *)malloc(Len << 4);
    Q->El[RoC] = pEVar2;
    if (pEVar2 != (ElType *)0x0) {
      do {
        *pEVar2 = ZeroEl;
        pEVar2 = pEVar2 + 1;
        Len = Len - 1;
      } while (Len != 0);
      return;
    }
    Object1Name = Q->Name;
    LVar1 = LASMemAllocErr;
    goto LAB_0010e694;
  }
  Object1Name = Q->Name;
  LVar1 = LASRangeErr;
LAB_0010e694:
  LASError(LVar1,"Q_SetLen",Object1Name,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void Q_SetLen(QMatrix *Q, size_t RoC, size_t Len)
/* set the lenght of a row or column of the matrix Q */
{
    size_t ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Q->Instance == Normal && RoC > 0 && RoC <= Q->Dim) {
            Q->Len[RoC] = Len;

            PtrEl = Q->El[RoC];

            if (PtrEl != NULL) {
                free(PtrEl);
		PtrEl = NULL;
	    }

            if (Len > 0) {
                PtrEl = (ElType *)malloc(Len * sizeof(ElType));
                Q->El[RoC] = PtrEl;

                if (PtrEl != NULL) {
                    for (ElCount = Len; ElCount > 0; ElCount--) {
                        *PtrEl = ZeroEl;
                        PtrEl++;
                    }
                } else {
                    LASError(LASMemAllocErr, "Q_SetLen", Q->Name, NULL, NULL);
                }
            } else {
                Q->El[RoC] = NULL;
            }
        } else {
            if (Q->Instance != Normal)
                LASError(LASLValErr, "Q_SetLen", Q->Name, NULL, NULL);
            else
                LASError(LASRangeErr, "Q_SetLen", Q->Name, NULL, NULL);
        }
    }
}